

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::assign_pow10(bigint *this,int exp)

{
  int iVar1;
  int iVar2;
  uint local_18;
  int bitmask;
  int exp_local;
  bigint *this_local;
  
  if (exp < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0xa76,"");
  }
  if (exp == 0) {
    operator=(this,1);
  }
  else {
    iVar1 = num_bits<unsigned_int>();
    iVar2 = countl_zero(exp);
    local_18 = 1 << (((char)iVar1 - (char)iVar2) - 1U & 0x1f);
    operator=(this,5);
    while (local_18 = (int)local_18 >> 1, local_18 != 0) {
      square(this);
      if ((exp & local_18) != 0) {
        operator*=(this,5);
      }
    }
    operator<<=(this,exp);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return *this = 1;
    int bitmask = 1 << (num_bits<unsigned>() -
                        countl_zero(static_cast<uint32_t>(exp)) - 1);
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    *this = 5;
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }